

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseConfig.h
# Opt level: O3

ConfigKey * ConfigKey::query_max_ngram(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ConfigKey *in_RDI;
  size_type *local_38;
  size_type local_30;
  size_type local_28;
  undefined8 uStack_20;
  
  local_38 = &local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"query_max_ngram","");
  paVar1 = &(in_RDI->key_).field_2;
  (in_RDI->key_)._M_dataplus._M_p = (pointer)paVar1;
  if (local_38 == &local_28) {
    paVar1->_M_allocated_capacity = local_28;
    *(undefined8 *)((long)&(in_RDI->key_).field_2 + 8) = uStack_20;
  }
  else {
    (in_RDI->key_)._M_dataplus._M_p = (pointer)local_38;
    (in_RDI->key_).field_2._M_allocated_capacity = local_28;
  }
  (in_RDI->key_)._M_string_length = local_30;
  in_RDI->defval_ = 0x10;
  in_RDI->min_ = 1;
  in_RDI->max_ = 0xffffff;
  return in_RDI;
}

Assistant:

const static ConfigKey query_max_ngram() {
        return ConfigKey("query_max_ngram", 16, 1, 16777215);
    }